

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newmem.c
# Opt level: O1

char * palloc_string(char *str)

{
  size_t sVar1;
  char *pcVar2;
  string_view fmt;
  
  if (str != (char *)0x0) {
    sVar1 = strlen(str);
    nAllocString = nAllocString + 1;
    pcVar2 = (char *)operator_new__((long)((int)sVar1 + 1));
    pcVar2 = strcpy(pcVar2,str);
    return pcVar2;
  }
  fmt._M_str = 
  "Bad code form that\'ll lead to free_pstr() crashes: attempting to palloc_string a nullptr.";
  fmt._M_len = 0x59;
  CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt);
  return (char *)0x0;
}

Assistant:

char *palloc_string(const char *str)
{
	char *tstr;
	int slen = strlen(str) + 1;
	if(str == nullptr)
	{
		RS.Logger.Warn("Bad code form that'll lead to free_pstr() crashes: attempting to palloc_string a nullptr.");
		return nullptr;
	}
	nAllocString++;
//	sAllocString += slen;
	tstr = new char[slen];
	if(!tstr)
	{
		RS.Logger.Warn("Unable to allocate pstring.");
		return nullptr;
	}
	strcpy(tstr,str);
	return tstr;
}